

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::RangeGenerator<int,_int>::Iterator::Iterator(Iterator *this,Iterator *other)

{
  Iterator *other_local;
  Iterator *this_local;
  
  memset(this,0,8);
  ParamIteratorInterface<int>::ParamIteratorInterface(&this->super_ParamIteratorInterface<int>);
  (this->super_ParamIteratorInterface<int>)._vptr_ParamIteratorInterface =
       (_func_int **)&PTR__Iterator_029f41d0;
  this->base_ = other->base_;
  this->value_ = other->value_;
  this->index_ = other->index_;
  this->step_ = other->step_;
  return;
}

Assistant:

Iterator(const Iterator& other)
        : ParamIteratorInterface<T>(),
          base_(other.base_),
          value_(other.value_),
          index_(other.index_),
          step_(other.step_) {}